

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O0

void __thiscall
Assimp::glTFExporter::GetTexSampler(glTFExporter *this,aiMaterial *mat,TexProperty *prop)

{
  element_type *peVar1;
  Texture *pTVar2;
  Sampler *pSVar3;
  Ref<glTF::Sampler> RVar4;
  int local_a0;
  int local_9c;
  aiTextureMapMode mapV;
  aiTextureMapMode mapU;
  uint local_90;
  vector<glTF::Sampler_*,_std::allocator<glTF::Sampler_*>_> *local_88;
  uint local_80;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string samplerId;
  TexProperty *prop_local;
  aiMaterial *mat_local;
  glTFExporter *this_local;
  
  samplerId.field_2._8_8_ = prop;
  peVar1 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->mAsset);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_61);
  glTF::Asset::FindUniqueID((string *)local_40,peVar1,&local_60,"sampler");
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  peVar1 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->mAsset);
  RVar4 = glTF::LazyDict<glTF::Sampler>::Create(&peVar1->samplers,(string *)local_40);
  _mapV = RVar4.vector;
  local_90 = RVar4.index;
  local_88 = _mapV;
  local_80 = local_90;
  pTVar2 = glTF::Ref<glTF::Texture>::operator->((Ref<glTF::Texture> *)samplerId.field_2._8_8_);
  (pTVar2->sampler).index = local_80;
  (pTVar2->sampler).vector = local_88;
  aiGetMaterialInteger(mat,"$tex.mapmodeu",1,0,&local_9c);
  aiGetMaterialInteger(mat,"$tex.mapmodev",1,0,&local_a0);
  switch(local_9c) {
  case 0:
    pTVar2 = glTF::Ref<glTF::Texture>::operator->((Ref<glTF::Texture> *)samplerId.field_2._8_8_);
    pSVar3 = glTF::Ref<glTF::Sampler>::operator->(&pTVar2->sampler);
    pSVar3->wrapS = SamplerWrap_Repeat;
    break;
  case 1:
    pTVar2 = glTF::Ref<glTF::Texture>::operator->((Ref<glTF::Texture> *)samplerId.field_2._8_8_);
    pSVar3 = glTF::Ref<glTF::Sampler>::operator->(&pTVar2->sampler);
    pSVar3->wrapS = SamplerWrap_Clamp_To_Edge;
    break;
  case 2:
    pTVar2 = glTF::Ref<glTF::Texture>::operator->((Ref<glTF::Texture> *)samplerId.field_2._8_8_);
    pSVar3 = glTF::Ref<glTF::Sampler>::operator->(&pTVar2->sampler);
    pSVar3->wrapS = SamplerWrap_Mirrored_Repeat;
    break;
  case 3:
  default:
    pTVar2 = glTF::Ref<glTF::Texture>::operator->((Ref<glTF::Texture> *)samplerId.field_2._8_8_);
    pSVar3 = glTF::Ref<glTF::Sampler>::operator->(&pTVar2->sampler);
    pSVar3->wrapS = SamplerWrap_Repeat;
  }
  switch(local_a0) {
  case 0:
    pTVar2 = glTF::Ref<glTF::Texture>::operator->((Ref<glTF::Texture> *)samplerId.field_2._8_8_);
    pSVar3 = glTF::Ref<glTF::Sampler>::operator->(&pTVar2->sampler);
    pSVar3->wrapT = SamplerWrap_Repeat;
    break;
  case 1:
    pTVar2 = glTF::Ref<glTF::Texture>::operator->((Ref<glTF::Texture> *)samplerId.field_2._8_8_);
    pSVar3 = glTF::Ref<glTF::Sampler>::operator->(&pTVar2->sampler);
    pSVar3->wrapT = SamplerWrap_Clamp_To_Edge;
    break;
  case 2:
    pTVar2 = glTF::Ref<glTF::Texture>::operator->((Ref<glTF::Texture> *)samplerId.field_2._8_8_);
    pSVar3 = glTF::Ref<glTF::Sampler>::operator->(&pTVar2->sampler);
    pSVar3->wrapT = SamplerWrap_Mirrored_Repeat;
    break;
  case 3:
  default:
    pTVar2 = glTF::Ref<glTF::Texture>::operator->((Ref<glTF::Texture> *)samplerId.field_2._8_8_);
    pSVar3 = glTF::Ref<glTF::Sampler>::operator->(&pTVar2->sampler);
    pSVar3->wrapT = SamplerWrap_Repeat;
  }
  pTVar2 = glTF::Ref<glTF::Texture>::operator->((Ref<glTF::Texture> *)samplerId.field_2._8_8_);
  pSVar3 = glTF::Ref<glTF::Sampler>::operator->(&pTVar2->sampler);
  pSVar3->magFilter = SamplerMagFilter_Linear;
  pTVar2 = glTF::Ref<glTF::Texture>::operator->((Ref<glTF::Texture> *)samplerId.field_2._8_8_);
  pSVar3 = glTF::Ref<glTF::Sampler>::operator->(&pTVar2->sampler);
  pSVar3->minFilter = SamplerMinFilter_Linear;
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void glTFExporter::GetTexSampler(const aiMaterial* mat, glTF::TexProperty& prop)
{
    std::string samplerId = mAsset->FindUniqueID("", "sampler");
    prop.texture->sampler = mAsset->samplers.Create(samplerId);

    aiTextureMapMode mapU, mapV;
    aiGetMaterialInteger(mat,AI_MATKEY_MAPPINGMODE_U_DIFFUSE(0),(int*)&mapU);
    aiGetMaterialInteger(mat,AI_MATKEY_MAPPINGMODE_V_DIFFUSE(0),(int*)&mapV);

    switch (mapU) {
        case aiTextureMapMode_Wrap:
            prop.texture->sampler->wrapS = SamplerWrap_Repeat;
            break;
        case aiTextureMapMode_Clamp:
            prop.texture->sampler->wrapS = SamplerWrap_Clamp_To_Edge;
            break;
        case aiTextureMapMode_Mirror:
            prop.texture->sampler->wrapS = SamplerWrap_Mirrored_Repeat;
            break;
        case aiTextureMapMode_Decal:
        default:
            prop.texture->sampler->wrapS = SamplerWrap_Repeat;
            break;
    };

    switch (mapV) {
        case aiTextureMapMode_Wrap:
            prop.texture->sampler->wrapT = SamplerWrap_Repeat;
            break;
        case aiTextureMapMode_Clamp:
            prop.texture->sampler->wrapT = SamplerWrap_Clamp_To_Edge;
            break;
        case aiTextureMapMode_Mirror:
            prop.texture->sampler->wrapT = SamplerWrap_Mirrored_Repeat;
            break;
        case aiTextureMapMode_Decal:
        default:
            prop.texture->sampler->wrapT = SamplerWrap_Repeat;
            break;
    };

    // Hard coded Texture filtering options because I do not know where to find them in the aiMaterial.
    prop.texture->sampler->magFilter = SamplerMagFilter_Linear;
    prop.texture->sampler->minFilter = SamplerMinFilter_Linear;
}